

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger thread_wakeupthrow(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQObjectValue v_00;
  SQTable *pSVar4;
  SQTable *pSVar5;
  SQObjectPtr *pSVar6;
  SQInteger SVar7;
  SQRESULT SVar8;
  char *err;
  SQBool rethrow_error;
  SQObjectPtr o;
  SQBool local_28;
  SQObjectPtr local_20;
  
  pSVar6 = SQVM::GetAt(v,v->_stackbase);
  local_20.super_SQObject._type = (pSVar6->super_SQObject)._type;
  v_00 = (SQObjectValue)(pSVar6->super_SQObject)._unVal.pGenerator;
  if ((local_20.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((v_00.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_20.super_SQObject._unVal = v_00;
  if (local_20.super_SQObject._type == OT_THREAD) {
    SVar7 = sq_getvmstate((HSQUIRRELVM)v_00.pTable);
    if (SVar7 == 0) {
      err = "cannot wakeup a idle thread";
    }
    else {
      if (SVar7 != 1) {
        sq_move((HSQUIRRELVM)v_00.pTable,v,2);
        sq_throwobject((HSQUIRRELVM)v_00.pTable);
        local_28 = 1;
        SVar7 = sq_gettop(v);
        if (2 < SVar7) {
          sq_getbool(v,3,&local_28);
        }
        SVar8 = sq_wakeupvm((HSQUIRRELVM)v_00.pTable,0,1,1,1);
        if (SVar8 < 0) {
          sq_settop((HSQUIRRELVM)v_00.pTable,1);
          if (local_28 == 0) {
            SVar8 = 0;
          }
          else {
            SVar2 = (v->_lasterror).super_SQObject._type;
            pSVar4 = (v->_lasterror).super_SQObject._unVal.pTable;
            pSVar5 = ((SQObjectValue *)&(v_00.pFunctionProto)->_nlineinfos)->pTable;
            (v->_lasterror).super_SQObject._unVal.pTable = pSVar5;
            SVar3 = ((v_00.pNativeClosure)->_name).super_SQObject._type;
            (v->_lasterror).super_SQObject._type = SVar3;
            if ((SVar3 >> 0x1b & 1) != 0) {
              pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 + 1;
            }
            SVar8 = -1;
            if ((SVar2 >> 0x1b & 1) != 0) {
              pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 - 1;
              if (*pSVar1 == 0) {
                (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                  _vptr_SQRefCounted[2])();
              }
            }
          }
        }
        else {
          sq_move(v,(HSQUIRRELVM)v_00.pTable,-1);
          sq_pop((HSQUIRRELVM)v_00.pTable,1);
          SVar7 = sq_getvmstate((HSQUIRRELVM)v_00.pTable);
          SVar8 = 1;
          if (SVar7 == 0) {
            sq_settop((HSQUIRRELVM)v_00.pTable,1);
          }
        }
        goto LAB_00129f09;
      }
      err = "cannot wakeup a running thread";
    }
    SVar8 = sq_throwerror(v,err);
  }
  else {
    SVar8 = sq_throwerror(v,"wrong parameter");
  }
LAB_00129f09:
  SQObjectPtr::~SQObjectPtr(&local_20);
  return SVar8;
}

Assistant:

static SQInteger thread_wakeupthrow(HSQUIRRELVM v)
{
    SQObjectPtr o = stack_get(v,1);
    if(sq_type(o) == OT_THREAD) {
        SQVM *thread = _thread(o);
        SQInteger state = sq_getvmstate(thread);
        if(state != SQ_VMSTATE_SUSPENDED) {
            switch(state) {
                case SQ_VMSTATE_IDLE:
                    return sq_throwerror(v,_SC("cannot wakeup a idle thread"));
                break;
                case SQ_VMSTATE_RUNNING:
                    return sq_throwerror(v,_SC("cannot wakeup a running thread"));
                break;
            }
        }

        sq_move(thread,v,2);
        sq_throwobject(thread);
        SQBool rethrow_error = SQTrue;
        if(sq_gettop(v) > 2) {
            sq_getbool(v,3,&rethrow_error);
        }
        if(SQ_SUCCEEDED(sq_wakeupvm(thread,SQFalse,SQTrue,SQTrue,SQTrue))) {
            sq_move(v,thread,-1);
            sq_pop(thread,1); //pop retval
            if(sq_getvmstate(thread) == SQ_VMSTATE_IDLE) {
                sq_settop(thread,1); //pop roottable
            }
            return 1;
        }
        sq_settop(thread,1);
        if(rethrow_error) {
            v->_lasterror = thread->_lasterror;
            return SQ_ERROR;
        }
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("wrong parameter"));
}